

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

void __thiscall QtMWidgets::PickerPrivate::normalizeOffset(PickerPrivate *this)

{
  PickerPrivate *pPVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int i;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  QModelIndex local_40;
  
  pPVar1 = (this->q->d).d;
  pQVar2 = pPVar1->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&pPVar1->root);
  iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_40);
  iVar6 = this->itemsCount;
  if (iVar3 < iVar6) {
    pPVar1 = (this->q->d).d;
    pQVar2 = pPVar1->model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_40,&pPVar1->root);
    iVar3 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_40);
    iVar6 = iVar6 - iVar3;
    iVar3 = 0;
    if (0 < iVar6) {
      iVar3 = iVar6 + -1;
    }
    if (-1 < this->drawItemOffset) {
      iVar6 = iVar3 * this->itemTopMargin + iVar6 * this->stringHeight;
      if (this->drawItemOffset <= iVar6) {
        return;
      }
      this->drawItemOffset = iVar6;
      return;
    }
    this->drawItemOffset = 0;
    return;
  }
  iVar6 = this->stringHeight + this->itemTopMargin;
  uVar5 = (long)this->drawItemOffset / (long)iVar6;
  iVar6 = this->drawItemOffset % iVar6;
  iVar3 = (int)uVar5;
  uVar5 = uVar5 & 0xffffffff;
  this->drawItemOffset = iVar6;
  if (iVar3 < 0) {
    do {
      makeNextIndex(this,&this->topItemIndex);
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  else {
    if (iVar3 == 0) goto LAB_00170977;
    do {
      makePrevIndex(this,&this->topItemIndex);
      uVar4 = (int)uVar5 - 1;
      uVar5 = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  iVar6 = this->drawItemOffset;
LAB_00170977:
  if (0 < iVar6) {
    this->drawItemOffset = iVar6 - (this->itemTopMargin + this->stringHeight);
    makePrevIndex(this,&this->topItemIndex);
  }
  return;
}

Assistant:

void
PickerPrivate::normalizeOffset()
{
	if( q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		if( drawItemOffset < 0 )
			drawItemOffset = 0;
		else if( drawItemOffset > maxOffset )
			drawItemOffset = maxOffset;
	}
	else
	{
		int fullItemsCount = drawItemOffset /
			( itemTopMargin + stringHeight );

		drawItemOffset -= ( itemTopMargin + stringHeight ) * fullItemsCount;

		if( fullItemsCount < 0 )
		{
			for( int i = fullItemsCount; i < 0; ++i )
				makeNextIndex( topItemIndex );
		}
		else if( fullItemsCount > 0 )
		{
			for( int i = 0; i < fullItemsCount; ++i )
				makePrevIndex( topItemIndex );
		}

		if( drawItemOffset > 0 )
		{
			drawItemOffset -= ( itemTopMargin + stringHeight );
			makePrevIndex( topItemIndex );
		}
	}
}